

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsEquality1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsEquality1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  long lVar3;
  long lVar4;
  string shader_source;
  
  lVar3 = 0x2238c78;
  if (supported_variable_types_map._16_8_ != 0) {
    lVar3 = 0x2238c78;
    lVar4 = supported_variable_types_map._16_8_;
    do {
      if (*(int *)Interface::GL::var_types <= *(int *)(lVar4 + 0x20)) {
        lVar3 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 +
                       (ulong)(*(int *)(lVar4 + 0x20) < *(int *)Interface::GL::var_types) * 8);
    } while (lVar4 != 0);
  }
  lVar4 = 0x2238c78;
  if ((lVar3 != 0x2238c78) &&
     (lVar4 = lVar3, *(int *)Interface::GL::var_types < *(int *)(lVar3 + 0x20))) {
    lVar4 = 0x2238c78;
  }
  if (lVar4 == 0x2238c78) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xdb3);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&shader_source,shader_start_abi_cxx11_,DAT_02233658 + shader_start_abi_cxx11_
            );
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x28));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)(lVar4 + 0x88));
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  puVar1 = &set_tesseation_abi_cxx11_;
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xdac);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xdaf);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*(code *)(&DAT_01b17f78 + *(int *)(&DAT_01b17f78 + (ulong)tested_shader_type * 4)))
            (&DAT_01b17f78 + *(int *)(&DAT_01b17f78 + (ulong)tested_shader_type * 4),
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_);
  return;
}

Assistant:

void ExpressionsEquality1<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = shader_start;

			shader_source += "    ";
			shader_source += var_iterator->second.type;
			shader_source += "[][] x = ";
			shader_source += var_iterator->second.type;
			shader_source += "[][](";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "),";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "));\n";
			shader_source += "    ";
			shader_source += var_iterator->second.type;
			shader_source += "[][] y = ";
			shader_source += var_iterator->second.type;
			shader_source += "[][](";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "),";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "));\n\n";
			shader_source += "    float result = 0.0;\n\n";
			shader_source += "    if (x == y)\n";
			shader_source += "    {\n";
			shader_source += "        result = 1.0;\n";
			shader_source += "    }\n";
			shader_source += "    if (y != x)\n";
			shader_source += "    {\n";
			shader_source += "        result = 2.0;\n";
			shader_source += "    }\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}